

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
::clear(Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
        *this)

{
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
  *entry_00;
  bool bVar1;
  reference ppEVar2;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
  *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range2;
  Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
  *this_local;
  
  __end0 = std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
           ::begin(&this->column_);
  entry = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
           *)std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
             ::end(&this->column_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>_>
              ::operator*(&__end0);
    entry_00 = *ppEVar2;
    Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
    ::unlink(&this->super_Row_access_option,(char *)entry_00);
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>
    ::destroy(this->entryPool_,entry_00);
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
  ::clear(&this->column_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->erasedValues_);
  return;
}

Assistant:

inline void Vector_column<Master_matrix>::clear()
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns as a base element should not be empty.");

  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }

  column_.clear();
  erasedValues_.clear();
}